

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O1

void duckdb::BinaryTrimFunction<false,true>(DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  data_ptr_t pdVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  data_ptr_t pdVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar10;
  ValidityMask *pVVar11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  reference vector;
  reference vector_00;
  idx_t iVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  idx_t iVar22;
  ValidityMask *in_R9;
  idx_t idx_in_entry;
  idx_t iVar23;
  data_ptr_t pdVar24;
  idx_t count;
  unsigned_long uVar25;
  anon_struct_16_3_d7536bce_for_pointer aVar26;
  string_t sVar27;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  UnifiedVectorFormat ldata;
  idx_t in_stack_fffffffffffffee8;
  anon_class_8_1_6971b95b aVar28;
  anon_class_8_1_6971b95b aVar29;
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar5 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      aVar26 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer,
                          (string_t)((anon_union_16_2_67f50693_for_value *)vector_00->data)->pointer
                          ,in_R9,in_stack_fffffffffffffee8);
      paVar5->pointer = aVar26;
      return;
    }
  }
  else {
    count = input->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar24 = vector->data;
      paVar5 = (anon_union_16_2_67f50693_for_value *)vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        aVar29.result = result;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          aVar26 = paVar5->pointer;
          lVar18 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + lVar18);
            left_02.value._0_8_ = *(undefined8 *)(pdVar24 + lVar18 + -8);
            sVar27 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,(string_t)aVar26,in_R9,
                                (idx_t)aVar29.result);
            *(long *)(pdVar6 + lVar18 + -8) = sVar27.value._0_8_;
            *(long *)(pdVar6 + lVar18) = sVar27.value._8_8_;
            lVar18 = lVar18 + 0x10;
            count = count - 1;
          } while (count != 0);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar16 = 0;
        uVar17 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar25 = 0xffffffffffffffff;
          }
          else {
            uVar25 = puVar4[uVar16];
          }
          uVar21 = uVar17 + 0x40;
          if (count <= uVar17 + 0x40) {
            uVar21 = count;
          }
          uVar20 = uVar21;
          aVar28.result = aVar29.result;
          if (uVar25 != 0) {
            uVar20 = uVar17;
            result = aVar29.result;
            if (uVar25 == 0xffffffffffffffff) {
              if (uVar17 < uVar21) {
                aVar26 = paVar5->pointer;
                uVar19 = uVar17 << 4 | 8;
                do {
                  left.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar19);
                  left.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar19 - 8));
                  sVar27 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (aVar29,left,(string_t)aVar26,in_R9,(idx_t)aVar28.result);
                  *(long *)(pdVar6 + (uVar19 - 8)) = sVar27.value._0_8_;
                  *(long *)(pdVar6 + uVar19) = sVar27.value._8_8_;
                  uVar17 = uVar17 + 1;
                  uVar19 = uVar19 + 0x10;
                  uVar20 = uVar17;
                } while (uVar21 != uVar17);
              }
            }
            else if (uVar17 < uVar21) {
              uVar19 = uVar17 << 4 | 8;
              uVar20 = 0;
              do {
                if ((uVar25 >> (uVar20 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar19);
                  left_00.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar19 - 8));
                  sVar27 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,
                                      (string_t)paVar5->pointer,in_R9,(idx_t)result);
                  *(long *)(pdVar6 + (uVar19 - 8)) = sVar27.value._0_8_;
                  *(long *)(pdVar6 + uVar19) = sVar27.value._8_8_;
                }
                uVar20 = uVar20 + 1;
                uVar19 = uVar19 + 0x10;
              } while ((uVar17 - uVar21) + uVar20 != 0);
              uVar20 = uVar17 + uVar20;
              aVar28.result = result;
            }
          }
          uVar16 = uVar16 + 1;
          uVar17 = uVar20;
          aVar29.result = aVar28.result;
        } while (uVar16 != count + 0x3f >> 6);
        return;
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar24 = vector->data;
          pdVar6 = vector_00->data;
          aVar29.result = result;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar9 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar18 = 8;
              do {
                sVar27.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + lVar18);
                sVar27.value._0_8_ = *(undefined8 *)(pdVar24 + lVar18 + -8);
                right_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar6 + lVar18);
                right_06.value._0_8_ = *(undefined8 *)(pdVar6 + lVar18 + -8);
                sVar27 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar27,right_06,in_R9,
                                    (idx_t)aVar29.result);
                *(long *)(pdVar9 + lVar18 + -8) = sVar27.value._0_8_;
                *(long *)(pdVar9 + lVar18) = sVar27.value._8_8_;
                lVar18 = lVar18 + 0x10;
                count = count - 1;
              } while (count != 0);
            }
          }
          else if (0x3f < count + 0x3f) {
            uVar16 = 0;
            uVar17 = 0;
            do {
              puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar25 = 0xffffffffffffffff;
              }
              else {
                uVar25 = puVar4[uVar16];
              }
              uVar21 = uVar17 + 0x40;
              if (count <= uVar17 + 0x40) {
                uVar21 = count;
              }
              uVar20 = uVar21;
              if (uVar25 != 0) {
                uVar20 = uVar17;
                if (uVar25 == 0xffffffffffffffff) {
                  if (uVar17 < uVar21) {
                    uVar17 = uVar17 << 4 | 8;
                    do {
                      left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar17);
                      left_03.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar17 - 8));
                      right_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar6 + uVar17);
                      right_02.value._0_8_ = *(undefined8 *)(pdVar6 + (uVar17 - 8));
                      sVar27 = BinaryLambdaWrapper::
                               Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         (aVar29,left_03,right_02,in_R9,(idx_t)aVar29.result);
                      *(long *)(pdVar9 + (uVar17 - 8)) = sVar27.value._0_8_;
                      *(long *)(pdVar9 + uVar17) = sVar27.value._8_8_;
                      uVar20 = uVar20 + 1;
                      uVar17 = uVar17 + 0x10;
                    } while (uVar21 != uVar20);
                  }
                }
                else if (uVar17 < uVar21) {
                  uVar20 = uVar17 << 4 | 8;
                  uVar19 = 0;
                  do {
                    if ((uVar25 >> (uVar19 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar20);
                      left_04.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar20 - 8));
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar6 + uVar20);
                      right_03.value._0_8_ = *(undefined8 *)(pdVar6 + (uVar20 - 8));
                      sVar27 = BinaryLambdaWrapper::
                               Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         (aVar29,left_04,right_03,in_R9,(idx_t)aVar29.result);
                      *(long *)(pdVar9 + (uVar20 - 8)) = sVar27.value._0_8_;
                      *(long *)(pdVar9 + uVar20) = sVar27.value._8_8_;
                    }
                    uVar19 = uVar19 + 1;
                    uVar20 = uVar20 + 0x10;
                  } while ((uVar17 - uVar21) + uVar19 != 0);
                  uVar20 = uVar17 + uVar19;
                }
              }
              uVar16 = uVar16 + 1;
              uVar17 = uVar20;
            } while (uVar16 != count + 0x3f >> 6);
          }
        }
        else {
          aVar29.result = result;
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
          Vector::ToUnifiedFormat(vector,count,&local_78);
          Vector::ToUnifiedFormat(vector_00,count,&local_c0);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar24 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              psVar7 = (local_78.sel)->sel_vector;
              psVar8 = (local_c0.sel)->sel_vector;
              pdVar24 = pdVar24 + 8;
              iVar23 = 0;
              do {
                iVar14 = iVar23;
                if (psVar7 != (sel_t *)0x0) {
                  iVar14 = (idx_t)psVar7[iVar23];
                }
                iVar22 = iVar23;
                if (psVar8 != (sel_t *)0x0) {
                  iVar22 = (idx_t)psVar8[iVar23];
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + iVar14 * 0x10 + 8);
                left_01.value._0_8_ = *(undefined8 *)(local_78.data + iVar14 * 0x10);
                right.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar22 * 0x10 + 8)
                ;
                right.value._0_8_ = *(undefined8 *)(local_c0.data + iVar22 * 0x10);
                sVar27 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   (aVar29,left_01,right,in_R9,(idx_t)aVar29.result);
                *(long *)(pdVar24 + -8) = sVar27.value._0_8_;
                *(long *)pdVar24 = sVar27.value._8_8_;
                iVar23 = iVar23 + 1;
                pdVar24 = pdVar24 + 0x10;
              } while (count != iVar23);
            }
          }
          else if (count != 0) {
            psVar7 = (local_78.sel)->sel_vector;
            psVar8 = (local_c0.sel)->sel_vector;
            pVVar11 = &(aVar29.result)->validity;
            pdVar24 = pdVar24 + 8;
            uVar17 = 0;
            do {
              uVar16 = uVar17;
              if (psVar7 != (sel_t *)0x0) {
                uVar16 = (ulong)psVar7[uVar17];
              }
              uVar21 = uVar17;
              if (psVar8 != (sel_t *)0x0) {
                uVar21 = (ulong)psVar8[uVar17];
              }
              if (((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0)) &&
                 ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_78.data + uVar16 * 0x10 + 8);
                left_05.value._0_8_ = *(undefined8 *)(local_78.data + uVar16 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_c0.data + uVar21 * 0x10 + 8);
                right_04.value._0_8_ = *(undefined8 *)(local_c0.data + uVar21 * 0x10);
                sVar27 = BinaryLambdaWrapper::
                         Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   (aVar29,left_05,right_04,in_R9,(idx_t)aVar29.result);
                *(long *)(pdVar24 + -8) = sVar27.value._0_8_;
                *(long *)pdVar24 = sVar27.value._8_8_;
              }
              else {
                if (((aVar29.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                    validity_mask == (unsigned_long *)0x0) {
                  local_c8 = ((aVar29.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                             capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var13 = p_Stack_d0;
                  peVar12 = local_d8;
                  local_d8 = (element_type *)0x0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = ((aVar29.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  ((aVar29.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                  validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar12;
                  ((aVar29.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                  validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var13;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(pVVar11->super_TemplatedValidityMask<unsigned_long>).
                                        validity_data);
                  ((aVar29.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                  validity_mask =
                       (unsigned_long *)
                       (pTVar15->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar10 = (byte)uVar17 & 0x3f;
                puVar1 = ((aVar29.result)->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_mask + (uVar17 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
              }
              uVar17 = uVar17 + 1;
              pdVar24 = pdVar24 + 0x10;
            } while (count != uVar17);
          }
          if (local_c0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      paVar5 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar24 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        aVar29.result = result;
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar6 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (count == 0) {
            return;
          }
          aVar26 = paVar5->pointer;
          lVar18 = 8;
          do {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + lVar18);
            right_05.value._0_8_ = *(undefined8 *)(pdVar24 + lVar18 + -8);
            sVar27 = BinaryLambdaWrapper::
                     Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar26,right_05,in_R9,
                                (idx_t)aVar29.result);
            *(long *)(pdVar6 + lVar18 + -8) = sVar27.value._0_8_;
            *(long *)(pdVar6 + lVar18) = sVar27.value._8_8_;
            lVar18 = lVar18 + 0x10;
            count = count - 1;
          } while (count != 0);
          return;
        }
        if (count + 0x3f < 0x40) {
          return;
        }
        uVar16 = 0;
        uVar17 = 0;
        do {
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar25 = 0xffffffffffffffff;
          }
          else {
            uVar25 = puVar4[uVar16];
          }
          uVar21 = uVar17 + 0x40;
          if (count <= uVar17 + 0x40) {
            uVar21 = count;
          }
          uVar20 = uVar21;
          result = aVar29.result;
          aVar28.result = aVar29.result;
          if (uVar25 != 0) {
            uVar20 = uVar17;
            if (uVar25 == 0xffffffffffffffff) {
              if (uVar17 < uVar21) {
                aVar26 = paVar5->pointer;
                uVar19 = uVar17 << 4 | 8;
                do {
                  right_00.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar19);
                  right_00.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar19 - 8));
                  sVar27 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (aVar29,(string_t)aVar26,right_00,in_R9,(idx_t)aVar28.result);
                  *(long *)(pdVar6 + (uVar19 - 8)) = sVar27.value._0_8_;
                  *(long *)(pdVar6 + uVar19) = sVar27.value._8_8_;
                  uVar17 = uVar17 + 1;
                  uVar19 = uVar19 + 0x10;
                  uVar20 = uVar17;
                } while (uVar21 != uVar17);
              }
            }
            else if (uVar17 < uVar21) {
              uVar20 = uVar17 << 4 | 8;
              uVar19 = 0;
              do {
                if ((uVar25 >> (uVar19 & 0x3f) & 1) != 0) {
                  right_01.value.pointer.ptr = (char *)*(undefined8 *)(pdVar24 + uVar20);
                  right_01.value._0_8_ = *(undefined8 *)(pdVar24 + (uVar20 - 8));
                  sVar27 = BinaryLambdaWrapper::
                           Operation<duckdb::BinaryTrimFunction<false,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     (aVar29,(string_t)paVar5->pointer,right_01,in_R9,
                                      (idx_t)aVar29.result);
                  *(long *)(pdVar6 + (uVar20 - 8)) = sVar27.value._0_8_;
                  *(long *)(pdVar6 + uVar20) = sVar27.value._8_8_;
                }
                uVar19 = uVar19 + 1;
                uVar20 = uVar20 + 0x10;
              } while ((uVar17 - uVar21) + uVar19 != 0);
              uVar20 = uVar17 + uVar19;
              result = aVar29.result;
              aVar28.result = aVar29.result;
            }
          }
          uVar16 = uVar16 + 1;
          uVar17 = uVar20;
          aVar29.result = aVar28.result;
        } while (uVar16 != count + 0x3f >> 6);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BinaryTrimFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    input.data[0], input.data[1], result, input.size(), [&](string_t input, string_t ignored) {
		    auto data = input.GetData();
		    auto size = input.GetSize();

		    unordered_set<utf8proc_int32_t> ignored_codepoints;
		    GetIgnoredCodepoints(ignored, ignored_codepoints);

		    utf8proc_int32_t codepoint;
		    auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		    // Find the first character that is not left trimmed
		    idx_t begin = 0;
		    if (LTRIM) {
			    while (begin < size) {
				    auto bytes =
				        utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    break;
				    }
				    begin += UnsafeNumericCast<idx_t>(bytes);
			    }
		    }

		    // Find the last character that is not right trimmed
		    idx_t end;
		    if (RTRIM) {
			    end = begin;
			    for (auto next = begin; next < size;) {
				    auto bytes =
				        utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				    D_ASSERT(bytes > 0);
				    next += UnsafeNumericCast<idx_t>(bytes);
				    if (ignored_codepoints.find(codepoint) == ignored_codepoints.end()) {
					    end = next;
				    }
			    }
		    } else {
			    end = size;
		    }

		    // Copy the trimmed string
		    auto target = StringVector::EmptyString(result, end - begin);
		    auto output = target.GetDataWriteable();
		    memcpy(output, data + begin, end - begin);

		    target.Finalize();
		    return target;
	    });
}